

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int buffer_push_encrypted_records
              (ptls_buffer_t *buf,uint8_t type,uint8_t *src,size_t len,
              st_ptls_traffic_protection_t *enc)

{
  size_t sVar1;
  st_ptls_aead_algorithm_t *psVar2;
  st_ptls_aead_context_t *psVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  uint8_t *puVar7;
  long lVar8;
  uint64_t seq;
  size_t inlen;
  undefined7 in_register_00000031;
  undefined2 local_5e;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined2 local_5a;
  uint local_58;
  undefined4 local_54;
  uint8_t *local_50;
  ulong local_48;
  uint8_t aad [13];
  
  local_54 = (undefined4)CONCAT71(in_register_00000031,type);
  local_58 = (uint)type;
  do {
    if (len == 0) {
      return 0;
    }
    inlen = 0x4000;
    if (len < 0x4000) {
      inlen = len;
    }
    if ((enc->field_0x58 & 1) == 0) {
      local_5e = 0x317;
      local_5c = 3;
      iVar4 = ptls_buffer__do_pushv(buf,&local_5e,3);
      if (iVar4 != 0) {
        return iVar4;
      }
      iVar4 = ptls_buffer__do_pushv(buf,"",2);
      if (iVar4 != 0) {
        return iVar4;
      }
      sVar1 = buf->off;
      psVar2 = enc->aead->algo;
      iVar4 = ptls_buffer_reserve_aligned(buf,psVar2->tag_size + inlen + 1,psVar2->align_bits);
      if (iVar4 != 0) {
        return iVar4;
      }
      sVar5 = aead_encrypt(enc,buf->base + buf->off,src,inlen,(uint8_t)local_58);
      sVar5 = sVar5 + buf->off;
      buf->off = sVar5;
      uVar6 = sVar5 - sVar1;
    }
    else {
      local_5b = (undefined1)local_54;
      local_5a = 0x303;
      iVar4 = ptls_buffer__do_pushv(buf,&local_5b,3);
      if (iVar4 != 0) {
        return iVar4;
      }
      iVar4 = ptls_buffer__do_pushv(buf,"",2);
      if (iVar4 != 0) {
        return iVar4;
      }
      sVar1 = buf->off;
      psVar2 = enc->aead->algo;
      iVar4 = ptls_buffer_reserve_aligned
                        (buf,(psVar2->tls12).record_iv_size + inlen + psVar2->tag_size,
                         psVar2->align_bits);
      if (iVar4 != 0) {
        return iVar4;
      }
      sVar5 = (enc->aead->algo->tls12).record_iv_size;
      local_50 = src;
      local_48 = len;
      if (sVar5 == 0) {
        seq = enc->seq;
        uVar6 = seq;
      }
      else {
        if (sVar5 != 8) {
          __assert_fail("enc->aead->algo->tls12.record_iv_size == 8",
                        "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                        ,0x30b,
                        "int buffer_push_encrypted_records(ptls_buffer_t *, uint8_t, const uint8_t *, size_t, struct st_ptls_traffic_protection_t *)"
                       );
        }
        uVar6 = enc->tls12_enc_record_iv;
        enc->tls12_enc_record_iv = uVar6 + 1;
        puVar7 = buf->base + buf->off;
        for (lVar8 = 0x38; lVar8 != -8; lVar8 = lVar8 + -8) {
          *puVar7 = (uint8_t)(uVar6 >> ((byte)lVar8 & 0x3f));
          puVar7 = puVar7 + 1;
        }
        buf->off = buf->off + 8;
        seq = enc->seq;
      }
      build_tls12_aad(aad,(uint8_t)local_58,seq,(uint16_t)inlen);
      src = local_50;
      psVar3 = enc->aead;
      (*psVar3->do_encrypt)
                (psVar3,buf->base + buf->off,local_50,inlen,uVar6,aad,0xd,
                 (ptls_aead_supplementary_encryption_t *)0x0);
      sVar5 = psVar3->algo->tag_size + inlen + buf->off;
      buf->off = sVar5;
      enc->seq = enc->seq + 1;
      uVar6 = sVar5 - sVar1;
      len = local_48;
    }
    if (0xffff < uVar6) {
      return 0x20c;
    }
    buf->base[sVar1 - 2] = (uint8_t)(uVar6 >> 8);
    buf->base[sVar1 - 1] = (uint8_t)uVar6;
    src = src + inlen;
    len = len - inlen;
  } while( true );
}

Assistant:

static int buffer_push_encrypted_records(ptls_buffer_t *buf, uint8_t type, const uint8_t *src, size_t len,
                                         struct st_ptls_traffic_protection_t *enc)
{
    int ret = 0;

    while (len != 0) {
        size_t chunk_size = len;
        if (chunk_size > PTLS_MAX_PLAINTEXT_RECORD_SIZE)
            chunk_size = PTLS_MAX_PLAINTEXT_RECORD_SIZE;
        if (enc->tls12) {
            buffer_push_record(buf, type, {
                /* reserve memory */
                if ((ret = ptls_buffer_reserve_aligned(
                         buf, enc->aead->algo->tls12.record_iv_size + chunk_size + enc->aead->algo->tag_size,
                         enc->aead->algo->align_bits)) != 0)
                    goto Exit;
                /* determine nonce, as well as prepending that walue as the record IV (AES-GCM) */
                uint64_t nonce;
                if (enc->aead->algo->tls12.record_iv_size != 0) {
                    assert(enc->aead->algo->tls12.record_iv_size == 8);
                    nonce = enc->tls12_enc_record_iv++;
                    encode64(buf->base + buf->off, nonce);
                    buf->off += 8;
                } else {
                    nonce = enc->seq;
                }
                /* build AAD */
                uint8_t aad[PTLS_TLS12_AAD_SIZE];
                build_tls12_aad(aad, type, enc->seq, (uint16_t)chunk_size);
                /* encrypt */
                buf->off += ptls_aead_encrypt(enc->aead, buf->base + buf->off, src, chunk_size, nonce, aad, sizeof(aad));
                ++enc->seq;
            });
        } else {
            buffer_push_record(buf, PTLS_CONTENT_TYPE_APPDATA, {
                if ((ret = ptls_buffer_reserve_aligned(buf, chunk_size + enc->aead->algo->tag_size + 1,
                                                       enc->aead->algo->align_bits)) != 0)
                    goto Exit;
                buf->off += aead_encrypt(enc, buf->base + buf->off, src, chunk_size, type);
            });
        }
        src += chunk_size;
        len -= chunk_size;
    }

Exit:
    return ret;
}